

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bbdpre.c
# Opt level: O0

int ARKBBDPrecGetNumGfnEvals(void *arkode_mem,long *ngevalsBBDP)

{
  undefined8 *in_RSI;
  int retval;
  ARKBBDPrecData pdata;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem *in_stack_ffffffffffffffd0;
  ARKodeMem *in_stack_ffffffffffffffd8;
  ARKodeMem in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkLs_AccessARKODELMem
                      (in_RSI,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                       in_stack_ffffffffffffffd0);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd8[0x1d] == (ARKodeMem)0x0) {
      arkProcessError(in_stack_ffffffffffffffe0,-5,0x173,"ARKBBDPrecGetNumGfnEvals",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                      ,"BBD peconditioner memory is NULL. ARKBBDPrecInit must be called.");
      local_4 = -5;
    }
    else {
      *in_RSI = in_stack_ffffffffffffffd8[0x1d]->step_init;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKBBDPrecGetNumGfnEvals(void* arkode_mem, long int* ngevalsBBDP)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKBBDPrecData pdata;
  int retval;

  /* access ARKodeMem and ARKLsMem structure */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Return immediately if ARKBBDPrecData is NULL */
  if (arkls_mem->P_data == NULL)
  {
    arkProcessError(ark_mem, ARKLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_BBD_PMEM_NULL);
    return (ARKLS_PMEM_NULL);
  }
  pdata = (ARKBBDPrecData)arkls_mem->P_data;

  /* set output */
  *ngevalsBBDP = pdata->nge;

  return (ARKLS_SUCCESS);
}